

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  tbinptr pmVar1;
  char *pcVar2;
  malloc_tree_chunk *pmVar3;
  mchunkptr pmVar4;
  uint uVar5;
  long lVar6;
  tbinptr pmVar7;
  mstate pmVar8;
  malloc_tree_chunk **ppmVar9;
  int iVar10;
  uint uVar11;
  malloc_tree_chunk *pmVar12;
  size_t __len;
  malloc_tree_chunk **ppmVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  mstate pmVar17;
  tbinptr pmVar18;
  
  pmVar1 = (tbinptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk);
  if ((m->dvsize & 1) == 0) {
    uVar14 = *(ulong *)m;
    if ((m->dvsize & 2) == 0) {
      __len = (long)&p[1].prev_foot + uVar14;
      iVar10 = munmap((void *)((long)m - uVar14),__len);
      if (iVar10 != 0) {
        return;
      }
      _gm_.footprint = _gm_.footprint - __len;
      return;
    }
    m = (mstate)((long)m - uVar14);
    if (m < _gm_.least_addr) goto LAB_00107025;
    p = (mchunkptr)((long)&p->prev_foot + uVar14);
    if (m == (mstate)_gm_.dv) {
      if ((~(uint)pmVar1->head & 3) == 0) {
        _gm_.dvsize = (size_t)p;
        pmVar1->head = pmVar1->head & 0xfffffffffffffffe;
        m->dvsize = (ulong)p | 1;
        pmVar1->prev_foot = (size_t)p;
        return;
      }
    }
    else if (uVar14 < 0x100) {
      pmVar12 = (malloc_tree_chunk *)m->topsize;
      pmVar3 = (malloc_tree_chunk *)m->least_addr;
      if ((pmVar12 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
         ((pmVar12 < _gm_.least_addr || ((mstate)pmVar12->bk != m)))) goto LAB_00107025;
      if (pmVar3 == pmVar12) {
        bVar15 = (byte)(uVar14 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
      }
      else {
        if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
           ((pmVar3 < _gm_.least_addr || ((mstate)pmVar3->fd != m)))) goto LAB_00107025;
        pmVar12->bk = pmVar3;
        pmVar3->fd = pmVar12;
      }
    }
    else {
      pmVar17 = (mstate)m->least_addr;
      pmVar12 = (malloc_tree_chunk *)m->trim_check;
      if (pmVar17 == m) {
        if ((mstate)m->top == (mstate)0x0) {
          if ((mstate)m->dv == (mstate)0x0) {
            pmVar17 = (mstate)0x0;
            goto LAB_00106b54;
          }
          pmVar8 = (mstate)m->dv;
          ppmVar9 = (malloc_tree_chunk **)&m->dv;
        }
        else {
          pmVar8 = (mstate)m->top;
          ppmVar9 = (malloc_tree_chunk **)&m->top;
        }
        do {
          do {
            ppmVar13 = ppmVar9;
            pmVar17 = pmVar8;
            pmVar8 = (mstate)pmVar17->top;
            ppmVar9 = (malloc_tree_chunk **)&pmVar17->top;
          } while ((mstate)pmVar17->top != (mstate)0x0);
          pmVar8 = (mstate)pmVar17->dv;
          ppmVar9 = (malloc_tree_chunk **)&pmVar17->dv;
        } while ((mstate)pmVar17->dv != (mstate)0x0);
        if (ppmVar13 < _gm_.least_addr) goto LAB_00107025;
        *ppmVar13 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar3 = (malloc_tree_chunk *)m->topsize;
        if (((pmVar3 < _gm_.least_addr) || ((mstate)pmVar3->bk != m)) ||
           ((mstate)pmVar17->topsize != m)) goto LAB_00107025;
        pmVar3->bk = (malloc_tree_chunk *)pmVar17;
        pmVar17->topsize = (size_t)pmVar3;
      }
LAB_00106b54:
      if (pmVar12 != (malloc_tree_chunk *)0x0) {
        uVar11 = (uint)m->release_checks;
        if (m == (mstate)_gm_.treebins[uVar11]) {
          _gm_.treebins[uVar11] = (tbinptr)pmVar17;
          if (pmVar17 == (mstate)0x0) {
            bVar15 = (byte)uVar11 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
          }
          else {
LAB_00106ba0:
            pcVar2 = _gm_.least_addr;
            if (pmVar17 < _gm_.least_addr) goto LAB_00107025;
            pmVar17->trim_check = (size_t)pmVar12;
            pmVar12 = (malloc_tree_chunk *)m->dv;
            if (pmVar12 != (malloc_tree_chunk *)0x0) {
              if (pmVar12 < pcVar2) goto LAB_00107025;
              pmVar17->dv = (mchunkptr)pmVar12;
              pmVar12->parent = (malloc_tree_chunk *)pmVar17;
            }
            pmVar4 = m->top;
            if (pmVar4 != (mchunkptr)0x0) {
              if (pmVar4 < pcVar2) goto LAB_00107025;
              pmVar17->top = pmVar4;
              pmVar4[1].fd = (malloc_chunk *)pmVar17;
            }
          }
        }
        else {
          if (pmVar12 < _gm_.least_addr) goto LAB_00107025;
          pmVar12->child[(mstate)pmVar12->child[0] != m] = (malloc_tree_chunk *)pmVar17;
          if (pmVar17 != (mstate)0x0) goto LAB_00106ba0;
        }
      }
    }
  }
  if (pmVar1 < _gm_.least_addr) goto LAB_00107025;
  uVar14 = pmVar1->head;
  if ((uVar14 & 2) == 0) {
    if (pmVar1 == (tbinptr)_gm_.top) {
      _gm_.topsize = (long)&p->prev_foot + _gm_.topsize;
      _gm_.top = (mchunkptr)m;
      m->dvsize = _gm_.topsize | 1;
      if (m != (mstate)_gm_.dv) {
        return;
      }
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      return;
    }
    if (pmVar1 == (tbinptr)_gm_.dv) {
      uVar14 = (long)&p->prev_foot + _gm_.dvsize;
      _gm_.dvsize = uVar14;
      _gm_.dv = (mchunkptr)m;
      m->dvsize = uVar14 | 1;
      *(ulong *)((long)m->smallbins + (uVar14 - 0x48)) = uVar14;
      return;
    }
    if (uVar14 < 0x100) {
      pmVar12 = pmVar1->fd;
      pmVar3 = pmVar1->bk;
      if ((pmVar12 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
         ((pmVar12 < _gm_.least_addr || (pmVar12->bk != pmVar1)))) goto LAB_00107025;
      if (pmVar3 == pmVar12) {
        bVar15 = (byte)(uVar14 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
      }
      else {
        if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
           ((pmVar3 < _gm_.least_addr || (pmVar3->fd != pmVar1)))) goto LAB_00107025;
        pmVar12->bk = pmVar3;
        pmVar3->fd = pmVar12;
      }
    }
    else {
      pmVar18 = pmVar1->bk;
      pmVar12 = pmVar1->parent;
      if (pmVar18 == pmVar1) {
        if (pmVar1->child[1] == (tbinptr)0x0) {
          if (pmVar1->child[0] == (tbinptr)0x0) {
            pmVar18 = (tbinptr)0x0;
            goto LAB_00106f51;
          }
          pmVar7 = pmVar1->child[0];
          ppmVar9 = pmVar1->child;
        }
        else {
          pmVar7 = pmVar1->child[1];
          ppmVar9 = pmVar1->child + 1;
        }
        do {
          do {
            ppmVar13 = ppmVar9;
            pmVar18 = pmVar7;
            pmVar7 = pmVar18->child[1];
            ppmVar9 = pmVar18->child + 1;
          } while (pmVar18->child[1] != (malloc_tree_chunk *)0x0);
          pmVar7 = pmVar18->child[0];
          ppmVar9 = pmVar18->child;
        } while (pmVar18->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar13 < _gm_.least_addr) goto LAB_00107025;
        *ppmVar13 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar3 = pmVar1->fd;
        if (((pmVar3 < _gm_.least_addr) || (pmVar3->bk != pmVar1)) || (pmVar18->fd != pmVar1))
        goto LAB_00107025;
        pmVar3->bk = pmVar18;
        pmVar18->fd = pmVar3;
      }
LAB_00106f51:
      if (pmVar12 != (malloc_tree_chunk *)0x0) {
        uVar11 = pmVar1->index;
        if (pmVar1 == _gm_.treebins[uVar11]) {
          _gm_.treebins[uVar11] = pmVar18;
          if (pmVar18 == (tbinptr)0x0) {
            bVar15 = (byte)uVar11 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar15 | 0xfffffffeU >> 0x20 - bVar15);
          }
          else {
LAB_00106f9d:
            pcVar2 = _gm_.least_addr;
            if (pmVar18 < _gm_.least_addr) goto LAB_00107025;
            pmVar18->parent = pmVar12;
            pmVar12 = pmVar1->child[0];
            if (pmVar12 != (malloc_tree_chunk *)0x0) {
              if (pmVar12 < pcVar2) goto LAB_00107025;
              pmVar18->child[0] = pmVar12;
              pmVar12->parent = pmVar18;
            }
            pmVar12 = pmVar1->child[1];
            if (pmVar12 != (malloc_tree_chunk *)0x0) {
              if (pmVar12 < pcVar2) goto LAB_00107025;
              pmVar18->child[1] = pmVar12;
              pmVar12->parent = pmVar18;
            }
          }
        }
        else {
          if (pmVar12 < _gm_.least_addr) goto LAB_00107025;
          pmVar12->child[pmVar12->child[0] != pmVar1] = pmVar18;
          if (pmVar18 != (tbinptr)0x0) goto LAB_00106f9d;
        }
      }
    }
    p = (mchunkptr)((long)&p->prev_foot + (uVar14 & 0xfffffffffffffff8));
    m->dvsize = (ulong)p | 1;
    *(mchunkptr *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk) = p;
    if (m == (mstate)_gm_.dv) {
      _gm_.dvsize = (size_t)p;
      return;
    }
  }
  else {
    pmVar1->head = uVar14 & 0xfffffffffffffffe;
    m->dvsize = (ulong)p | 1;
    *(mchunkptr *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk) = p;
  }
  if (p < (mchunkptr)0x100) {
    uVar14 = (ulong)p >> 3;
    if ((_gm_.smallmap >> ((uint)uVar14 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar14 & 0x1f);
      pmVar12 = (malloc_tree_chunk *)(_gm_.smallbins + uVar14 * 2);
    }
    else {
      pmVar12 = (malloc_tree_chunk *)_gm_.smallbins[uVar14 * 2 + 2];
      if ((malloc_tree_chunk *)_gm_.smallbins[uVar14 * 2 + 2] < _gm_.least_addr) {
LAB_00107025:
        abort();
      }
    }
    _gm_.smallbins[uVar14 * 2 + 2] = (mchunkptr)m;
    pmVar12->bk = (malloc_tree_chunk *)m;
    m->topsize = (size_t)pmVar12;
    m->least_addr = (char *)(_gm_.smallbins + uVar14 * 2);
  }
  else {
    uVar11 = (uint)((ulong)p >> 8);
    if (uVar11 == 0) {
      uVar14 = 0;
    }
    else if (uVar11 < 0x10000) {
      uVar5 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar14 = (ulong)((uint)(((ulong)p >> ((ulong)(byte)(0x26 - (char)(uVar5 ^ 0x1f)) & 0x3f) & 1)
                             != 0) + (uVar5 ^ 0x1f) * 2 ^ 0x3e);
    }
    else {
      uVar14 = 0x1f;
    }
    uVar11 = (uint)uVar14;
    pmVar12 = (malloc_tree_chunk *)(_gm_.treebins + uVar14);
    *(uint *)&m->release_checks = uVar11;
    m->dv = (mchunkptr)0x0;
    m->top = (mchunkptr)0x0;
    if ((_gm_.treemap >> (uVar11 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar14 & 0x1f);
      pmVar12->prev_foot = (size_t)m;
    }
    else {
      bVar15 = 0x39 - (char)(uVar14 >> 1);
      if (uVar11 == 0x1f) {
        bVar15 = 0;
      }
      lVar16 = (long)p << (bVar15 & 0x3f);
      pmVar3 = (malloc_tree_chunk *)pmVar12->prev_foot;
      do {
        pmVar12 = pmVar3;
        if ((mchunkptr)(pmVar12->head & 0xfffffffffffffff8) == p) {
          if ((_gm_.least_addr <= pmVar12) && (pmVar3 = pmVar12->fd, _gm_.least_addr <= pmVar3)) {
            pmVar3->bk = (malloc_tree_chunk *)m;
            pmVar12->fd = (malloc_tree_chunk *)m;
            m->topsize = (size_t)pmVar3;
            m->least_addr = (char *)pmVar12;
            m->trim_check = 0;
            return;
          }
          goto LAB_00107025;
        }
        lVar6 = lVar16 >> 0x3f;
        lVar16 = lVar16 * 2;
        pmVar3 = *(malloc_tree_chunk **)((long)pmVar12 + lVar6 * -8 + 0x20);
      } while (pmVar3 != (malloc_tree_chunk *)0x0);
      pcVar2 = (char *)((long)pmVar12 + lVar6 * -8 + 0x20);
      if (pcVar2 < _gm_.least_addr) goto LAB_00107025;
      *(mstate *)pcVar2 = m;
    }
    m->trim_check = (size_t)pmVar12;
    m->least_addr = (char *)m;
    m->topsize = (size_t)m;
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}